

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Expression * __thiscall slang::ast::PortConnection::getExpression(PortConnection *this)

{
  pointer pvVar1;
  SourceRange sourceRange;
  string_view arg;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  bool bVar2;
  InstanceSymbol *inst;
  Type *type_00;
  Compilation *this_00;
  SourceLocation SVar3;
  Expression *pEVar4;
  Type *lhsExpr;
  Diagnostic *in_RDI;
  LookupLocation LVar5;
  pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> pVar6;
  PortSymbol *ps;
  Diagnostic *diag;
  EmptyArgumentExpression *rhs;
  not_null<const_slang::ast::Type_*> exprType;
  Compilation *comp;
  bitmask<slang::ast::AssignFlags> assignFlags;
  Expression *e;
  ASTContext context;
  bitmask<slang::ast::ASTFlags> flags;
  type *type;
  type *direction;
  bool isNetPort;
  Scope *scope;
  LookupLocation ll;
  InstanceSymbol *parentInstance;
  undefined1 in_stack_00000216;
  undefined1 in_stack_00000217;
  HierarchicalReference *in_stack_00000218;
  Symbol *in_stack_00000220;
  ASTContext *in_stack_00000228;
  SourceRange in_stack_00000230;
  bitmask<slang::ast::InstanceFlags> *in_stack_fffffffffffffe28;
  uint uVar7;
  not_null<const_slang::ast::Type_*> *u;
  Type *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  SourceLocation in_stack_fffffffffffffe50;
  SourceLocation in_stack_fffffffffffffe58;
  DiagCode code;
  bool local_191;
  Type *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  Type *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  ArgumentDirection direction_00;
  Expression *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  bitmask<slang::ast::AssignFlags> flags_00;
  SourceLocation in_stack_fffffffffffffea8;
  ASTContext *in_stack_fffffffffffffeb8;
  ExpressionSyntax *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  ArgumentDirection direction_01;
  Type *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  bitmask<slang::ast::VariableFlags> argFlags;
  bitmask<slang::ast::AssignFlags> local_102;
  bitmask<slang::ast::AssignFlags> local_101;
  pointer local_100;
  pointer local_f8;
  InvalidExpression *local_f0;
  underlying_type local_e8;
  SourceLocation local_e0;
  undefined8 local_d8;
  TempVarSymbol *in_stack_ffffffffffffff50;
  bitmask<slang::ast::ASTFlags> local_98;
  bitmask<slang::ast::InstanceFlags> local_89;
  bitmask<slang::ast::ASTFlags> local_88;
  bitmask<slang::ast::ASTFlags> local_80;
  bitmask<slang::ast::ASTFlags> local_78;
  bitmask<slang::ast::ASTFlags> local_70;
  type *local_68;
  type *local_60;
  ArgumentDirection local_58;
  undefined7 in_stack_ffffffffffffffb8;
  uint32_t uVar8;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uStack_1c;
  Diagnostic *assignFlags_00;
  Expression *local_8;
  SourceLocation context_00;
  
  flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffea0 >> 0x38);
  direction_00 = (ArgumentDirection)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  argFlags.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffed8 >> 0x30);
  direction_01 = (ArgumentDirection)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  if (((in_RDI->args).
       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
     (*(int *)&(((in_RDI->args).
                 super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
               ).
               super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
      != 0x2b)) {
    if (((in_RDI->args).
         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) &&
       ((in_RDI->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0)) {
      if (((ulong)(in_RDI->notes).
                  super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
                  super__Vector_impl_data._M_start & 1) != 0) {
        Symbol::as<slang::ast::PortSymbol>((Symbol *)0x107d0ef);
        pEVar4 = PortSymbol::getInitializer((PortSymbol *)in_stack_ffffffffffffff50);
        (in_RDI->args).
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pEVar4;
      }
    }
    else {
      assignFlags_00 = in_RDI;
      inst = getParentInstance((PortConnection *)in_stack_fffffffffffffe30);
      LVar5 = LookupLocation::after(&in_stack_fffffffffffffe30->super_Symbol);
      context_00 = (SourceLocation)LVar5.scope;
      uVar8 = LVar5.index;
      SVar3 = context_00;
      type_00 = (Type *)LookupLocation::getScope((LookupLocation *)&stack0xffffffffffffffd8);
      local_191 = false;
      if (*(int *)&(((in_RDI->args).
                     super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                   ).
                   super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
          == 0x29) {
        Symbol::as<slang::ast::PortSymbol>((Symbol *)0x107ca85);
        local_191 = PortSymbol::isNetPort
                              ((PortSymbol *)
                               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
      pVar6 = getDirAndType((Symbol *)in_stack_fffffffffffffe50);
      lhsExpr = pVar6.second;
      local_58 = pVar6.first;
      local_60 = std::get<0ul,slang::ast::ArgumentDirection,slang::ast::Type_const*>
                           ((pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> *)
                            0x107cac8);
      local_68 = std::get<1ul,slang::ast::ArgumentDirection,slang::ast::Type_const*>
                           ((pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> *)
                            0x107cadd);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_70,NonProcedural);
      if ((local_191 & 1U) != 0) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_78,AllowInterconnect);
        bitmask<slang::ast::ASTFlags>::operator|=(&local_70,&local_78);
      }
      if ((*local_60 == Out) || (*local_60 == InOut)) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_80,LValue);
        bitmask<slang::ast::ASTFlags>::operator|=(&local_70,&local_80);
        if (*local_60 == InOut) {
          bitmask<slang::ast::ASTFlags>::bitmask(&local_88,LAndRValue);
          bitmask<slang::ast::ASTFlags>::operator|=(&local_70,&local_88);
        }
      }
      code = SUB84((ulong)&inst->body->flags >> 0x20,0);
      bitmask<slang::ast::InstanceFlags>::bitmask(&local_89,FromBind);
      bVar2 = bitmask<slang::ast::InstanceFlags>::has
                        ((bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe28);
      uVar7 = (uint)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      local_e0 = SVar3;
      if (bVar2) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_98,BindInstantiation);
        bitmask<slang::ast::ASTFlags>::operator|=(&local_70,&local_98);
        local_e0 = SVar3;
      }
      local_d8 = CONCAT44(uStack_1c,LVar5.index);
      local_e8 = local_70.m_bits;
      LVar5.scope._4_4_ = in_stack_fffffffffffffe4c;
      LVar5.scope._0_4_ = in_stack_fffffffffffffe48;
      LVar5._8_8_ = in_stack_fffffffffffffe50;
      SVar3 = local_e0;
      ASTContext::ASTContext
                ((ASTContext *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (Scope *)in_stack_fffffffffffffe30,LVar5,in_stack_fffffffffffffe40);
      ASTContext::setInstance
                ((ASTContext *)&stack0xffffffffffffff30,&inst->super_InstanceSymbolBase);
      if ((in_RDI->args).
          super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        memset(&stack0xfffffffffffffe84,0,2);
        bitmask<slang::ast::VariableFlags>::bitmask
                  ((bitmask<slang::ast::VariableFlags> *)&stack0xfffffffffffffe84);
        pEVar4 = Expression::bindArgument
                           (in_stack_fffffffffffffed0,direction_01,argFlags,
                            in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        (in_RDI->args).
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pEVar4;
      }
      else {
        local_100 = (in_RDI->ranges).
                    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        local_f8 = (in_RDI->ranges).
                   super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        u = (not_null<const_slang::ast::Type_*> *)((ulong)uVar7 << 0x20);
        local_f0 = (InvalidExpression *)
                   ValueExpressionBase::fromSymbol
                             (in_stack_00000228,in_stack_00000220,in_stack_00000218,
                              in_stack_00000230,(bool)in_stack_00000217,(bool)in_stack_00000216);
        bitmask<slang::ast::AssignFlags>::bitmask(&local_101);
        if (*local_60 == Out) {
          bitmask<slang::ast::AssignFlags>::bitmask(&local_102,OutputPort);
          local_101.m_bits = local_102.m_bits;
        }
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x107cd31);
        bVar2 = Type::isEquivalent(in_stack_fffffffffffffe88,
                                   (Type *)CONCAT17(in_stack_fffffffffffffe87,
                                                    in_stack_fffffffffffffe80));
        if (!bVar2) {
          this_00 = ASTContext::getCompilation((ASTContext *)0x107cd59);
          not_null<const_slang::ast::Type_*>::not_null<slang::not_null<const_slang::ast::Type_*>_&>
                    ((not_null<const_slang::ast::Type_*> *)in_stack_fffffffffffffe30,u);
          if (*local_60 == In) {
            assignmentRange.startLoc._4_4_ = in_stack_ffffffffffffffd4;
            assignmentRange.startLoc._0_4_ = uVar8;
            assignmentRange.endLoc = SVar3;
            local_f0 = (InvalidExpression *)
                       Expression::convertAssignment
                                 ((ASTContext *)context_00,type_00,
                                  (Expression *)CONCAT17(local_191,in_stack_ffffffffffffffb8),
                                  assignmentRange,(Expression **)lhsExpr,
                                  (bitmask<slang::ast::AssignFlags> *)assignFlags_00);
          }
          else if (*local_60 != Ref) {
            BumpAllocator::
            emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange_const&>
                      ((BumpAllocator *)in_stack_fffffffffffffe50,
                       (Type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       (SourceRange *)in_stack_fffffffffffffe40.m_bits);
            not_null<const_slang::ast::Type_*>::operator*
                      ((not_null<const_slang::ast::Type_*> *)0x107ce39);
            assignmentRange_00.startLoc._4_4_ = in_stack_ffffffffffffffd4;
            assignmentRange_00.startLoc._0_4_ = uVar8;
            assignmentRange_00.endLoc = SVar3;
            Expression::convertAssignment
                      ((ASTContext *)context_00,type_00,
                       (Expression *)CONCAT17(local_191,in_stack_ffffffffffffffb8),
                       assignmentRange_00,(Expression **)lhsExpr,
                       (bitmask<slang::ast::AssignFlags> *)assignFlags_00);
          }
          bVar2 = std::span<const_unsigned_int,_18446744073709551615UL>::empty
                            ((span<const_unsigned_int,_18446744073709551615UL> *)0x107cea5);
          if ((((bVar2) || (*local_60 == Ref)) &&
              (bVar2 = Expression::bad((Expression *)in_stack_fffffffffffffe30), !bVar2)) &&
             (bVar2 = Type::isError((Type *)0x107cedf), !bVar2)) {
            flags_00.m_bits =
                 (underlying_type)
                 ((ulong)(in_RDI->ranges).
                         super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                         ._M_impl.super__Vector_impl_data._M_finish >> 0x38);
            in_stack_fffffffffffffea8 =
                 (SourceLocation)
                 (in_RDI->ranges).
                 super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
            sourceRange.endLoc = in_stack_fffffffffffffe58;
            sourceRange.startLoc = in_stack_fffffffffffffe50;
            ASTContext::addDiag((ASTContext *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),code,
                                sourceRange);
            pvVar1 = (in_RDI->args).
                     super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            direction_00 = (ArgumentDirection)
                           ((ulong)*(undefined8 *)
                                    ((long)&(pvVar1->
                                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                            ).
                                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                    + 8) >> 0x20);
            in_stack_fffffffffffffe98 =
                 *(Expression **)
                  ((long)&(pvVar1->
                          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                          ).
                          super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                  + 0x10);
            arg._M_str._0_7_ = in_stack_fffffffffffffe80;
            arg._M_len = (size_t)in_stack_fffffffffffffe78;
            arg._M_str._7_1_ = in_stack_fffffffffffffe87;
            Diagnostic::operator<<(in_RDI,arg);
            ast::operator<<((Diagnostic *)
                            CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe78);
            not_null<const_slang::ast::Type_*>::operator*
                      ((not_null<const_slang::ast::Type_*> *)0x107cf9d);
            ast::operator<<((Diagnostic *)
                            CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe78);
            if (*local_60 == Ref) {
              Compilation::getErrorType(this_00);
              local_f0 = BumpAllocator::
                         emplace<slang::ast::InvalidExpression,slang::ast::Expression*&,slang::ast::Type_const&>
                                   ((BumpAllocator *)in_stack_fffffffffffffe40.m_bits,
                                    (Expression **)
                                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                    in_stack_fffffffffffffe30);
            }
          }
        }
        (in_RDI->args).
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f0;
        bVar2 = Expression::bad((Expression *)in_stack_fffffffffffffe30);
        if (!bVar2) {
          SVar3 = SourceRange::start((SourceRange *)
                                     ((long)&(((in_RDI->args).
                                               super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                             ).
                                             super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                             .
                                             super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                             .
                                             super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                             .
                                             super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                             .
                                             super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                             ._M_u + 0x20));
          Expression::checkConnectionDirection
                    (in_stack_fffffffffffffe98,direction_00,(ASTContext *)SVar3,
                     in_stack_fffffffffffffea8,flags_00);
        }
      }
    }
    local_8 = (Expression *)
              (in_RDI->args).
              super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_8 = (Expression *)
              (in_RDI->args).
              super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  return local_8;
}

Assistant:

const Expression* PortConnection::getExpression() const {
    if (expr || port.kind == SymbolKind::InterfacePort)
        return expr;

    if (connectedSymbol || exprSyntax) {
        auto& parentInstance = getParentInstance();
        auto ll = LookupLocation::after(parentInstance);
        auto scope = ll.getScope();
        SLANG_ASSERT(scope);

        const bool isNetPort = port.kind == SymbolKind::Port && port.as<PortSymbol>().isNetPort();
        auto [direction, type] = getDirAndType(port);

        bitmask<ASTFlags> flags = ASTFlags::NonProcedural;
        if (isNetPort)
            flags |= ASTFlags::AllowInterconnect;

        if (direction == ArgumentDirection::Out || direction == ArgumentDirection::InOut) {
            flags |= ASTFlags::LValue;
            if (direction == ArgumentDirection::InOut)
                flags |= ASTFlags::LAndRValue;
        }

        if (parentInstance.body.flags.has(InstanceFlags::FromBind))
            flags |= ASTFlags::BindInstantiation;

        ASTContext context(*scope, ll, flags);
        context.setInstance(parentInstance);

        if (connectedSymbol) {
            Expression* e = &ValueExpressionBase::fromSymbol(context, *connectedSymbol, nullptr,
                                                             implicitNameRange);

            bitmask<AssignFlags> assignFlags;
            if (direction == ArgumentDirection::Out)
                assignFlags = AssignFlags::OutputPort;

            if (!e->type->isEquivalent(*type)) {
                auto& comp = context.getCompilation();
                auto exprType = e->type;
                if (direction == ArgumentDirection::In) {
                    e = &Expression::convertAssignment(context, *type, *e, implicitNameRange);
                }
                else if (direction != ArgumentDirection::Ref) {
                    auto rhs = comp.emplace<EmptyArgumentExpression>(*type, implicitNameRange);
                    Expression::convertAssignment(context, *e->type, *rhs, implicitNameRange, &e,
                                                  &assignFlags);
                }

                // We should warn for this case unless convertAssignment already issued an error,
                // or if we're in an instance array unwrapping case.
                if ((parentInstance.arrayPath.empty() || direction == ArgumentDirection::Ref) &&
                    !e->bad() && !type->isError()) {
                    auto& diag = context.addDiag(diag::ImplicitNamedPortTypeMismatch,
                                                 implicitNameRange);
                    diag << port.name;
                    diag << *type;
                    diag << *exprType;

                    // There's no way to represent this expression for the ref case.
                    if (direction == ArgumentDirection::Ref)
                        e = comp.emplace<InvalidExpression>(e, comp.getErrorType());
                }
            }

            expr = e;
            if (!expr->bad()) {
                Expression::checkConnectionDirection(*expr, direction, context,
                                                     expr->sourceRange.start(), assignFlags);
            }
        }
        else {
            expr = &Expression::bindArgument(*type, direction, {}, *exprSyntax, context);
        }
    }
    else if (useDefault) {
        auto& ps = port.as<PortSymbol>();
        expr = ps.getInitializer();
    }

    return expr;
}